

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getvariable.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BindGetVariableExpression(duckdb *this,FunctionBindExpressionInput *input)

{
  FunctionData *pFVar1;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  if ((input->bind_data).ptr != (FunctionData *)0x0) {
    pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&input->bind_data);
    make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>
              ((duckdb *)&local_38,(Value *)(pFVar1 + 1));
    *(pointer *)this = local_38._M_dataplus._M_p;
    return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"input.bind_data should be set",&local_39);
  InternalException::InternalException(this_00,&local_38);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> BindGetVariableExpression(FunctionBindExpressionInput &input) {
	if (!input.bind_data) {
		// unknown type
		throw InternalException("input.bind_data should be set");
	}
	auto &bind_data = input.bind_data->Cast<GetVariableBindData>();
	// emit a constant expression
	return make_uniq<BoundConstantExpression>(bind_data.value);
}